

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_16781328,_false,_embree::avx512::VirtualCurveIntersectorK<8>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined8 uVar15;
  ulong uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  byte bVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  char cVar33;
  byte bVar34;
  bool bVar35;
  AABBNodeMB4D *node1;
  uint uVar36;
  ulong uVar37;
  byte bVar38;
  undefined4 uVar39;
  ulong *puVar40;
  long lVar41;
  ulong uVar42;
  NodeRef root;
  uint uVar43;
  undefined1 (*pauVar44) [32];
  byte bVar45;
  ulong uVar46;
  ulong uVar47;
  int iVar72;
  undefined1 auVar50 [16];
  int iVar48;
  undefined1 auVar51 [16];
  int iVar70;
  int iVar71;
  int iVar73;
  int iVar74;
  int iVar75;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar49 [16];
  undefined1 auVar54 [32];
  int iVar76;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 in_ZMM4 [64];
  float fVar82;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar83 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  vfloat4 a0;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  TravRayK<8,_false> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  uint local_5c44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5be0;
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  uint local_5a40;
  uint uStack_5a3c;
  uint uStack_5a38;
  uint uStack_5a34;
  uint uStack_5a30;
  uint uStack_5a2c;
  uint uStack_5a28;
  uint uStack_5a24;
  uint local_5a20;
  uint uStack_5a1c;
  uint uStack_5a18;
  uint uStack_5a14;
  uint uStack_5a10;
  uint uStack_5a0c;
  uint uStack_5a08;
  uint uStack_5a04;
  uint local_5a00;
  uint uStack_59fc;
  uint uStack_59f8;
  uint uStack_59f4;
  uint uStack_59f0;
  uint uStack_59ec;
  uint uStack_59e8;
  uint uStack_59e4;
  undefined1 local_59e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_59c0;
  undefined1 local_59a0 [16];
  undefined1 auStack_5990 [16];
  undefined1 auStack_5980 [368];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  uint local_4660;
  uint uStack_465c;
  uint uStack_4658;
  uint uStack_4654;
  uint uStack_4650;
  uint uStack_464c;
  uint uStack_4648;
  uint uStack_4644;
  undefined1 local_4640 [17936];
  
  bvh = (BVH *)This->ptr;
  sVar1 = (bvh->root).ptr;
  if (sVar1 != 8) {
    auVar56 = *(undefined1 (*) [32])(ray + 0x100);
    auVar53 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar46 = vcmpps_avx512vl(auVar56,ZEXT1632(ZEXT816(0) << 0x40),5);
    uVar37 = vpcmpeqd_avx512vl(auVar53,(undefined1  [32])valid_i->field_0);
    uVar46 = uVar46 & uVar37;
    bVar45 = (byte)uVar46;
    if (bVar45 != 0) {
      local_5b80 = *(undefined1 (*) [32])(ray + 0x80);
      local_5b60 = *(undefined1 (*) [32])(ray + 0xa0);
      local_5b40 = *(undefined1 (*) [32])(ray + 0xc0);
      fVar8 = local_5b40._0_4_;
      auVar107._0_4_ = fVar8 * fVar8;
      fVar9 = local_5b40._4_4_;
      auVar107._4_4_ = fVar9 * fVar9;
      fVar10 = local_5b40._8_4_;
      auVar107._8_4_ = fVar10 * fVar10;
      fVar11 = local_5b40._12_4_;
      auVar107._12_4_ = fVar11 * fVar11;
      fVar12 = local_5b40._16_4_;
      auVar107._16_4_ = fVar12 * fVar12;
      fVar13 = local_5b40._20_4_;
      auVar107._20_4_ = fVar13 * fVar13;
      fVar14 = local_5b40._24_4_;
      auVar107._28_36_ = in_ZMM4._28_36_;
      auVar107._24_4_ = fVar14 * fVar14;
      auVar51 = vfmadd231ps_fma(auVar107._0_32_,local_5b60,local_5b60);
      auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),local_5b80,local_5b80);
      auVar52 = vrsqrt14ps_avx512vl(ZEXT1632(auVar51));
      auVar53._8_4_ = 0xbf000000;
      auVar53._0_8_ = 0xbf000000bf000000;
      auVar53._12_4_ = 0xbf000000;
      auVar53._16_4_ = 0xbf000000;
      auVar53._20_4_ = 0xbf000000;
      auVar53._24_4_ = 0xbf000000;
      auVar53._28_4_ = 0xbf000000;
      auVar53 = vmulps_avx512vl(ZEXT1632(auVar51),auVar53);
      fVar82 = auVar52._0_4_;
      fVar86 = auVar52._4_4_;
      fVar87 = auVar52._8_4_;
      fVar88 = auVar52._12_4_;
      fVar89 = auVar52._16_4_;
      fVar90 = auVar52._20_4_;
      fVar91 = auVar52._24_4_;
      auVar51._0_4_ = fVar82 * fVar82;
      auVar51._4_4_ = fVar86 * fVar86;
      auVar51._8_4_ = fVar87 * fVar87;
      auVar51._12_4_ = fVar88 * fVar88;
      auVar55._4_4_ = auVar51._4_4_ * fVar86 * auVar53._4_4_;
      auVar55._0_4_ = auVar51._0_4_ * fVar82 * auVar53._0_4_;
      auVar55._8_4_ = auVar51._8_4_ * fVar87 * auVar53._8_4_;
      auVar55._12_4_ = auVar51._12_4_ * fVar88 * auVar53._12_4_;
      auVar55._16_4_ = fVar89 * fVar89 * fVar89 * auVar53._16_4_;
      auVar55._20_4_ = fVar90 * fVar90 * fVar90 * auVar53._20_4_;
      auVar55._24_4_ = fVar91 * fVar91 * fVar91 * auVar53._24_4_;
      auVar55._28_4_ = auVar53._28_4_;
      auVar54._8_4_ = 0x3fc00000;
      auVar54._0_8_ = 0x3fc000003fc00000;
      auVar54._12_4_ = 0x3fc00000;
      auVar54._16_4_ = 0x3fc00000;
      auVar54._20_4_ = 0x3fc00000;
      auVar54._24_4_ = 0x3fc00000;
      auVar54._28_4_ = 0x3fc00000;
      local_59c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                   vfmadd231ps_avx512vl(auVar55,auVar52,auVar54);
      auVar79._8_4_ = 0x80000000;
      auVar79._0_8_ = 0x8000000080000000;
      auVar79._12_4_ = 0x80000000;
      auVar83._12_4_ = 0;
      auVar83._0_12_ = ZEXT812(0);
      auVar83 = auVar83 << 0x20;
      auVar51 = vpcmpeqd_avx(auVar51,auVar51);
      uVar37 = uVar46;
      while (uVar37 != 0) {
        lVar41 = 0;
        for (uVar47 = uVar37; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
          lVar41 = lVar41 + 1;
        }
        uVar37 = uVar37 - 1 & uVar37;
        uVar47 = (ulong)(uint)((int)lVar41 * 4);
        auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar47 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar47 + 0xa0)),0x1c);
        auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + uVar47 + 0xc0)),0x28);
        fVar82 = *(float *)((long)&local_59c0 + uVar47);
        auVar97._0_4_ = auVar50._0_4_ * fVar82;
        auVar97._4_4_ = auVar50._4_4_ * fVar82;
        auVar97._8_4_ = auVar50._8_4_ * fVar82;
        auVar97._12_4_ = auVar50._12_4_ * fVar82;
        auVar98 = vshufpd_avx(auVar97,auVar97,1);
        auVar50 = vmovshdup_avx(auVar97);
        auVar49 = vunpckhps_avx(auVar97,auVar83);
        auVar100 = vshufps_avx(auVar49,ZEXT416(auVar50._0_4_ ^ 0x80000000),0x41);
        auVar49._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
        auVar49._8_8_ = auVar98._8_8_ ^ auVar79._8_8_;
        auVar50 = vdpps_avx(auVar100,auVar100,0x7f);
        auVar49 = vinsertps_avx(auVar49,auVar97,0x2a);
        auVar98 = vdpps_avx(auVar49,auVar49,0x7f);
        uVar15 = vcmpps_avx512vl(auVar98,auVar50,1);
        auVar50 = vpmovm2d_avx512vl(uVar15);
        auVar104._0_4_ = auVar50._0_4_;
        auVar104._4_4_ = auVar104._0_4_;
        auVar104._8_4_ = auVar104._0_4_;
        auVar104._12_4_ = auVar104._0_4_;
        uVar47 = vpmovd2m_avx512vl(auVar104);
        auVar50._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar51._4_4_;
        auVar50._0_4_ = (uint)((byte)uVar47 & 1) * auVar51._0_4_;
        auVar50._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar51._8_4_;
        auVar50._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar51._12_4_;
        auVar50 = vblendvps_avx(auVar49,auVar100,auVar50);
        auVar98 = vdpps_avx(auVar50,auVar50,0x7f);
        auVar49 = vrsqrt14ss_avx512f(auVar83,ZEXT416((uint)auVar98._0_4_));
        fVar86 = auVar49._0_4_;
        fVar86 = fVar86 * 1.5 - auVar98._0_4_ * 0.5 * fVar86 * fVar86 * fVar86;
        auVar100._0_4_ = auVar50._0_4_ * fVar86;
        auVar100._4_4_ = auVar50._4_4_ * fVar86;
        auVar100._8_4_ = auVar50._8_4_ * fVar86;
        auVar100._12_4_ = auVar50._12_4_ * fVar86;
        auVar50 = vshufps_avx(auVar100,auVar100,0xc9);
        auVar98 = vshufps_avx(auVar97,auVar97,0xc9);
        auVar105._0_4_ = auVar100._0_4_ * auVar98._0_4_;
        auVar105._4_4_ = auVar100._4_4_ * auVar98._4_4_;
        auVar105._8_4_ = auVar100._8_4_ * auVar98._8_4_;
        auVar105._12_4_ = auVar100._12_4_ * auVar98._12_4_;
        auVar50 = vfmsub231ps_fma(auVar105,auVar97,auVar50);
        auVar98 = vshufps_avx(auVar50,auVar50,0xc9);
        auVar50 = vdpps_avx(auVar98,auVar98,0x7f);
        auVar49 = vrsqrt14ss_avx512f(auVar83,ZEXT416((uint)auVar50._0_4_));
        fVar86 = auVar49._0_4_;
        fVar86 = fVar86 * 1.5 - auVar50._0_4_ * 0.5 * fVar86 * fVar86 * fVar86;
        auVar102._0_4_ = fVar86 * auVar98._0_4_;
        auVar102._4_4_ = fVar86 * auVar98._4_4_;
        auVar102._8_4_ = fVar86 * auVar98._8_4_;
        auVar102._12_4_ = fVar86 * auVar98._12_4_;
        auVar98._0_4_ = fVar82 * auVar97._0_4_;
        auVar98._4_4_ = fVar82 * auVar97._4_4_;
        auVar98._8_4_ = fVar82 * auVar97._8_4_;
        auVar98._12_4_ = fVar82 * auVar97._12_4_;
        auVar49 = vunpcklps_avx(auVar100,auVar98);
        auVar50 = vunpckhps_avx(auVar100,auVar98);
        auVar100 = vunpcklps_avx(auVar102,auVar83);
        auVar98 = vunpckhps_avx(auVar102,auVar83);
        auVar98 = vunpcklps_avx(auVar50,auVar98);
        auVar97 = vunpcklps_avx(auVar49,auVar100);
        auVar50 = vunpckhps_avx(auVar49,auVar100);
        lVar41 = lVar41 * 0x30;
        *(undefined1 (*) [16])(local_59a0 + lVar41) = auVar97;
        *(undefined1 (*) [16])(auStack_5990 + lVar41) = auVar50;
        *(undefined1 (*) [16])(auStack_5980 + lVar41) = auVar98;
      }
      local_5be0._0_4_ = *(undefined4 *)ray;
      local_5be0._4_4_ = *(undefined4 *)(ray + 4);
      local_5be0._8_4_ = *(undefined4 *)(ray + 8);
      local_5be0._12_4_ = *(undefined4 *)(ray + 0xc);
      local_5be0._16_4_ = *(undefined4 *)(ray + 0x10);
      local_5be0._20_4_ = *(undefined4 *)(ray + 0x14);
      local_5be0._24_4_ = *(undefined4 *)(ray + 0x18);
      local_5be0._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_5be0._32_4_ = *(undefined4 *)(ray + 0x20);
      local_5be0._36_4_ = *(undefined4 *)(ray + 0x24);
      local_5be0._40_4_ = *(undefined4 *)(ray + 0x28);
      local_5be0._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_5be0._48_4_ = *(undefined4 *)(ray + 0x30);
      local_5be0._52_4_ = *(undefined4 *)(ray + 0x34);
      local_5be0._56_4_ = *(undefined4 *)(ray + 0x38);
      local_5be0._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_5be0._64_4_ = *(undefined4 *)(ray + 0x40);
      local_5be0._68_4_ = *(undefined4 *)(ray + 0x44);
      local_5be0._72_4_ = *(undefined4 *)(ray + 0x48);
      local_5be0._76_4_ = *(undefined4 *)(ray + 0x4c);
      local_5be0._80_4_ = *(undefined4 *)(ray + 0x50);
      local_5be0._84_4_ = *(undefined4 *)(ray + 0x54);
      local_5be0._88_4_ = *(undefined4 *)(ray + 0x58);
      local_5be0._92_4_ = *(undefined4 *)(ray + 0x5c);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar107 = ZEXT3264(auVar53);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar108 = ZEXT3264(auVar54);
      vandps_avx512vl(local_5b80,auVar53);
      uVar37 = vcmpps_avx512vl(auVar54,auVar54,1);
      bVar35 = (bool)((byte)uVar37 & 1);
      iVar48 = auVar54._0_4_;
      auVar52._0_4_ = (uint)bVar35 * iVar48 | (uint)!bVar35 * local_5b80._0_4_;
      bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
      iVar70 = auVar54._4_4_;
      auVar52._4_4_ = (uint)bVar35 * iVar70 | (uint)!bVar35 * local_5b80._4_4_;
      bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
      iVar71 = auVar54._8_4_;
      auVar52._8_4_ = (uint)bVar35 * iVar71 | (uint)!bVar35 * local_5b80._8_4_;
      bVar35 = (bool)((byte)(uVar37 >> 3) & 1);
      iVar72 = auVar54._12_4_;
      auVar52._12_4_ = (uint)bVar35 * iVar72 | (uint)!bVar35 * local_5b80._12_4_;
      bVar35 = (bool)((byte)(uVar37 >> 4) & 1);
      iVar73 = auVar54._16_4_;
      auVar52._16_4_ = (uint)bVar35 * iVar73 | (uint)!bVar35 * local_5b80._16_4_;
      bVar35 = (bool)((byte)(uVar37 >> 5) & 1);
      iVar74 = auVar54._20_4_;
      auVar52._20_4_ = (uint)bVar35 * iVar74 | (uint)!bVar35 * local_5b80._20_4_;
      bVar35 = (bool)((byte)(uVar37 >> 6) & 1);
      iVar75 = auVar54._24_4_;
      iVar76 = auVar54._28_4_;
      auVar52._24_4_ = (uint)bVar35 * iVar75 | (uint)!bVar35 * local_5b80._24_4_;
      bVar35 = SUB81(uVar37 >> 7,0);
      auVar52._28_4_ = (uint)bVar35 * iVar76 | (uint)!bVar35 * local_5b80._28_4_;
      vandps_avx512vl(local_5b60,auVar53);
      uVar37 = vcmpps_avx512vl(auVar52,auVar54,1);
      bVar35 = (bool)((byte)uVar37 & 1);
      auVar57._0_4_ = (uint)bVar35 * iVar48 | (uint)!bVar35 * local_5b60._0_4_;
      bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar57._4_4_ = (uint)bVar35 * iVar70 | (uint)!bVar35 * local_5b60._4_4_;
      bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar57._8_4_ = (uint)bVar35 * iVar71 | (uint)!bVar35 * local_5b60._8_4_;
      bVar35 = (bool)((byte)(uVar37 >> 3) & 1);
      auVar57._12_4_ = (uint)bVar35 * iVar72 | (uint)!bVar35 * local_5b60._12_4_;
      bVar35 = (bool)((byte)(uVar37 >> 4) & 1);
      auVar57._16_4_ = (uint)bVar35 * iVar73 | (uint)!bVar35 * local_5b60._16_4_;
      bVar35 = (bool)((byte)(uVar37 >> 5) & 1);
      auVar57._20_4_ = (uint)bVar35 * iVar74 | (uint)!bVar35 * local_5b60._20_4_;
      bVar35 = (bool)((byte)(uVar37 >> 6) & 1);
      auVar57._24_4_ = (uint)bVar35 * iVar75 | (uint)!bVar35 * local_5b60._24_4_;
      bVar35 = SUB81(uVar37 >> 7,0);
      auVar57._28_4_ = (uint)bVar35 * iVar76 | (uint)!bVar35 * local_5b60._28_4_;
      vandps_avx512vl(local_5b40,auVar53);
      uVar37 = vcmpps_avx512vl(auVar57,auVar54,1);
      bVar35 = (bool)((byte)uVar37 & 1);
      auVar58._0_4_ = (uint)bVar35 * iVar48 | (uint)!bVar35 * (int)fVar8;
      bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar58._4_4_ = (uint)bVar35 * iVar70 | (uint)!bVar35 * (int)fVar9;
      bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar58._8_4_ = (uint)bVar35 * iVar71 | (uint)!bVar35 * (int)fVar10;
      bVar35 = (bool)((byte)(uVar37 >> 3) & 1);
      auVar58._12_4_ = (uint)bVar35 * iVar72 | (uint)!bVar35 * (int)fVar11;
      bVar35 = (bool)((byte)(uVar37 >> 4) & 1);
      auVar58._16_4_ = (uint)bVar35 * iVar73 | (uint)!bVar35 * (int)fVar12;
      bVar35 = (bool)((byte)(uVar37 >> 5) & 1);
      auVar58._20_4_ = (uint)bVar35 * iVar74 | (uint)!bVar35 * (int)fVar13;
      bVar35 = (bool)((byte)(uVar37 >> 6) & 1);
      auVar58._24_4_ = (uint)bVar35 * iVar75 | (uint)!bVar35 * (int)fVar14;
      bVar35 = SUB81(uVar37 >> 7,0);
      auVar58._28_4_ = (uint)bVar35 * iVar76 | (uint)!bVar35 * local_5b40._28_4_;
      auVar53 = vrcp14ps_avx512vl(auVar52);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar109 = ZEXT3264(auVar54);
      auVar50 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
      auVar110 = ZEXT1664(auVar50);
      auVar55 = vfnmadd213ps_avx512vl(auVar52,auVar53,auVar54);
      auVar51 = vfmadd132ps_fma(auVar55,auVar53,auVar53);
      auVar53 = vrcp14ps_avx512vl(auVar57);
      auVar55 = vfnmadd213ps_avx512vl(auVar57,auVar53,auVar54);
      auVar83 = vfmadd132ps_fma(auVar55,auVar53,auVar53);
      auVar53 = vrcp14ps_avx512vl(auVar58);
      auVar54 = vfnmadd213ps_avx512vl(auVar58,auVar53,auVar54);
      local_5b20 = ZEXT1632(auVar51);
      local_5b00 = ZEXT1632(auVar83);
      auVar79 = vfmadd132ps_fma(auVar54,auVar53,auVar53);
      local_5ae0 = ZEXT1632(auVar79);
      local_5ac0._4_4_ = (float)local_5be0._4_4_ * auVar51._4_4_;
      local_5ac0._0_4_ = (float)local_5be0._0_4_ * auVar51._0_4_;
      local_5ac0._8_4_ = (float)local_5be0._8_4_ * auVar51._8_4_;
      local_5ac0._12_4_ = (float)local_5be0._12_4_ * auVar51._12_4_;
      local_5ac0._16_4_ = (float)local_5be0._16_4_ * 0.0;
      local_5ac0._20_4_ = (float)local_5be0._20_4_ * 0.0;
      local_5ac0._24_4_ = (float)local_5be0._24_4_ * 0.0;
      local_5ac0._28_4_ = local_5be0._28_4_;
      local_5aa0._4_4_ = (float)local_5be0._36_4_ * auVar83._4_4_;
      local_5aa0._0_4_ = (float)local_5be0._32_4_ * auVar83._0_4_;
      local_5aa0._8_4_ = (float)local_5be0._40_4_ * auVar83._8_4_;
      local_5aa0._12_4_ = (float)local_5be0._44_4_ * auVar83._12_4_;
      local_5aa0._16_4_ = (float)local_5be0._48_4_ * 0.0;
      local_5aa0._20_4_ = (float)local_5be0._52_4_ * 0.0;
      local_5aa0._24_4_ = (float)local_5be0._56_4_ * 0.0;
      local_5aa0._28_4_ = local_5be0._60_4_;
      local_5a80._4_4_ = (float)local_5be0._68_4_ * auVar79._4_4_;
      local_5a80._0_4_ = (float)local_5be0._64_4_ * auVar79._0_4_;
      local_5a80._8_4_ = (float)local_5be0._72_4_ * auVar79._8_4_;
      local_5a80._12_4_ = (float)local_5be0._76_4_ * auVar79._12_4_;
      local_5a80._16_4_ = (float)local_5be0._80_4_ * 0.0;
      local_5a80._20_4_ = (float)local_5be0._84_4_ * 0.0;
      local_5a80._24_4_ = (float)local_5be0._88_4_ * 0.0;
      local_5a80._28_4_ = local_5be0._92_4_;
      uVar37 = vcmpps_avx512vl(ZEXT1632(auVar51),ZEXT1632(auVar50),1);
      auVar53 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      local_5a60._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar53._4_4_;
      local_5a60._0_4_ = (uint)((byte)uVar37 & 1) * auVar53._0_4_;
      local_5a60._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar53._8_4_;
      local_5a60._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar53._12_4_;
      local_5a60._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar53._16_4_;
      local_5a60._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar53._20_4_;
      local_5a60._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar53._24_4_;
      local_5a60._28_4_ = (uint)(byte)(uVar37 >> 7) * auVar53._28_4_;
      uVar37 = vcmpps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar50),5);
      auVar53 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar35 = (bool)((byte)uVar37 & 1);
      local_5a40 = (uint)bVar35 * auVar53._0_4_ | (uint)!bVar35 * 0x60;
      bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
      uStack_5a3c = (uint)bVar35 * auVar53._4_4_ | (uint)!bVar35 * 0x60;
      bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
      uStack_5a38 = (uint)bVar35 * auVar53._8_4_ | (uint)!bVar35 * 0x60;
      bVar35 = (bool)((byte)(uVar37 >> 3) & 1);
      uStack_5a34 = (uint)bVar35 * auVar53._12_4_ | (uint)!bVar35 * 0x60;
      bVar35 = (bool)((byte)(uVar37 >> 4) & 1);
      uStack_5a30 = (uint)bVar35 * auVar53._16_4_ | (uint)!bVar35 * 0x60;
      bVar35 = (bool)((byte)(uVar37 >> 5) & 1);
      uStack_5a2c = (uint)bVar35 * auVar53._20_4_ | (uint)!bVar35 * 0x60;
      bVar35 = (bool)((byte)(uVar37 >> 6) & 1);
      uStack_5a28 = (uint)bVar35 * auVar53._24_4_ | (uint)!bVar35 * 0x60;
      bVar35 = SUB81(uVar37 >> 7,0);
      uStack_5a24 = (uint)bVar35 * auVar53._28_4_ | (uint)!bVar35 * 0x60;
      auVar54 = ZEXT1632(auVar50);
      uVar37 = vcmpps_avx512vl(ZEXT1632(auVar79),auVar54,5);
      auVar53 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar35 = (bool)((byte)uVar37 & 1);
      local_5a20 = (uint)bVar35 * auVar53._0_4_ | (uint)!bVar35 * 0xa0;
      bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
      uStack_5a1c = (uint)bVar35 * auVar53._4_4_ | (uint)!bVar35 * 0xa0;
      bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
      uStack_5a18 = (uint)bVar35 * auVar53._8_4_ | (uint)!bVar35 * 0xa0;
      bVar35 = (bool)((byte)(uVar37 >> 3) & 1);
      uStack_5a14 = (uint)bVar35 * auVar53._12_4_ | (uint)!bVar35 * 0xa0;
      bVar35 = (bool)((byte)(uVar37 >> 4) & 1);
      uStack_5a10 = (uint)bVar35 * auVar53._16_4_ | (uint)!bVar35 * 0xa0;
      bVar35 = (bool)((byte)(uVar37 >> 5) & 1);
      uStack_5a0c = (uint)bVar35 * auVar53._20_4_ | (uint)!bVar35 * 0xa0;
      bVar35 = (bool)((byte)(uVar37 >> 6) & 1);
      uStack_5a08 = (uint)bVar35 * auVar53._24_4_ | (uint)!bVar35 * 0xa0;
      bVar35 = SUB81(uVar37 >> 7,0);
      uStack_5a04 = (uint)bVar35 * auVar53._28_4_ | (uint)!bVar35 * 0xa0;
      local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar111 = ZEXT3264(local_4680);
      auVar53 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar54);
      local_5a00 = (uint)(bVar45 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar45 & 1) * local_4680._0_4_
      ;
      bVar35 = (bool)((byte)(uVar46 >> 1) & 1);
      uStack_59fc = (uint)bVar35 * auVar53._4_4_ | (uint)!bVar35 * local_4680._4_4_;
      bVar35 = (bool)((byte)(uVar46 >> 2) & 1);
      uStack_59f8 = (uint)bVar35 * auVar53._8_4_ | (uint)!bVar35 * local_4680._8_4_;
      bVar35 = (bool)((byte)(uVar46 >> 3) & 1);
      uStack_59f4 = (uint)bVar35 * auVar53._12_4_ | (uint)!bVar35 * local_4680._12_4_;
      bVar35 = (bool)((byte)(uVar46 >> 4) & 1);
      uStack_59f0 = (uint)bVar35 * auVar53._16_4_ | (uint)!bVar35 * local_4680._16_4_;
      bVar35 = (bool)((byte)(uVar46 >> 5) & 1);
      uStack_59ec = (uint)bVar35 * auVar53._20_4_ | (uint)!bVar35 * local_4680._20_4_;
      bVar35 = (bool)((byte)(uVar46 >> 6) & 1);
      uStack_59e8 = (uint)bVar35 * auVar53._24_4_ | (uint)!bVar35 * local_4680._24_4_;
      bVar35 = SUB81(uVar46 >> 7,0);
      uStack_59e4 = (uint)bVar35 * auVar53._28_4_ | (uint)!bVar35 * local_4680._28_4_;
      auVar56 = vmaxps_avx512vl(auVar56,auVar54);
      local_59e0._0_4_ = (uint)(bVar45 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar45 & 1) * -0x800000;
      bVar35 = (bool)((byte)(uVar46 >> 1) & 1);
      local_59e0._4_4_ = (uint)bVar35 * auVar56._4_4_ | (uint)!bVar35 * -0x800000;
      bVar35 = (bool)((byte)(uVar46 >> 2) & 1);
      local_59e0._8_4_ = (uint)bVar35 * auVar56._8_4_ | (uint)!bVar35 * -0x800000;
      bVar35 = (bool)((byte)(uVar46 >> 3) & 1);
      local_59e0._12_4_ = (uint)bVar35 * auVar56._12_4_ | (uint)!bVar35 * -0x800000;
      bVar35 = (bool)((byte)(uVar46 >> 4) & 1);
      local_59e0._16_4_ = (uint)bVar35 * auVar56._16_4_ | (uint)!bVar35 * -0x800000;
      bVar35 = (bool)((byte)(uVar46 >> 5) & 1);
      local_59e0._20_4_ = (uint)bVar35 * auVar56._20_4_ | (uint)!bVar35 * -0x800000;
      bVar35 = (bool)((byte)(uVar46 >> 6) & 1);
      local_59e0._24_4_ = (uint)bVar35 * auVar56._24_4_ | (uint)!bVar35 * -0x800000;
      bVar35 = SUB81(uVar46 >> 7,0);
      local_59e0._28_4_ = (uint)bVar35 * auVar56._28_4_ | (uint)!bVar35 * -0x800000;
      local_5c44 = (uint)(byte)~bVar45;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar43 = 7;
      }
      else {
        uVar43 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      puVar40 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar44 = (undefined1 (*) [32])local_4640;
      local_5808 = sVar1;
      local_4660 = local_5a00;
      uStack_465c = uStack_59fc;
      uStack_4658 = uStack_59f8;
      uStack_4654 = uStack_59f4;
      uStack_4650 = uStack_59f0;
      uStack_464c = uStack_59ec;
      uStack_4648 = uStack_59e8;
      uStack_4644 = uStack_59e4;
LAB_01de60f4:
      do {
        do {
          root.ptr = puVar40[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01de67de;
          puVar40 = puVar40 + -1;
          auVar56 = pauVar44[-1];
          auVar112 = ZEXT3264(auVar56);
          pauVar44 = pauVar44 + -1;
          uVar46 = vcmpps_avx512vl(auVar56,local_59e0,1);
        } while ((char)uVar46 == '\0');
        uVar39 = (undefined4)uVar46;
        if (uVar43 < (uint)POPCOUNT(uVar39)) {
LAB_01de613b:
          do {
            lVar41 = -0x20;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01de67de;
              uVar15 = vcmpps_avx512vl(auVar112._0_32_,local_59e0,9);
              if ((char)uVar15 != '\0') {
                bVar34 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar2 = This->leafIntersector;
                uVar46 = (ulong)(byte)~(byte)local_5c44;
                bVar38 = 0;
                while (uVar46 != 0) {
                  lVar41 = 0;
                  for (uVar37 = uVar46; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000
                      ) {
                    lVar41 = lVar41 + 1;
                  }
                  uVar46 = uVar46 - 1 & uVar46;
                  cVar33 = (**(code **)((long)pvVar2 + (ulong)bVar34 * 0x40 + 0x28))
                                     (&local_59c0,ray,lVar41,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  bVar28 = (byte)(1 << ((uint)lVar41 & 0x1f));
                  if (cVar33 == '\0') {
                    bVar28 = 0;
                  }
                  bVar38 = bVar38 | bVar28;
                }
                bVar38 = (byte)local_5c44 | bVar38;
                local_5c44 = (uint)bVar38;
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar107 = ZEXT3264(auVar56);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar108 = ZEXT3264(auVar56);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar109 = ZEXT3264(auVar56);
                auVar51 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
                auVar110 = ZEXT1664(auVar51);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar111 = ZEXT3264(auVar56);
                if (bVar38 == 0xff) {
                  local_5c44._0_1_ = 0xff;
                  goto LAB_01de67de;
                }
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar35 = (bool)(bVar38 >> 1 & 1);
                bVar3 = (bool)(bVar38 >> 2 & 1);
                bVar4 = (bool)(bVar38 >> 3 & 1);
                bVar5 = (bool)(bVar38 >> 4 & 1);
                bVar6 = (bool)(bVar38 >> 5 & 1);
                bVar7 = (bool)(bVar38 >> 6 & 1);
                local_59e0._4_4_ = (uint)bVar35 * auVar56._4_4_ | (uint)!bVar35 * local_59e0._4_4_;
                local_59e0._0_4_ =
                     (uint)(bVar38 & 1) * auVar56._0_4_ |
                     (uint)!(bool)(bVar38 & 1) * local_59e0._0_4_;
                local_59e0._8_4_ = (uint)bVar3 * auVar56._8_4_ | (uint)!bVar3 * local_59e0._8_4_;
                local_59e0._12_4_ = (uint)bVar4 * auVar56._12_4_ | (uint)!bVar4 * local_59e0._12_4_;
                local_59e0._16_4_ = (uint)bVar5 * auVar56._16_4_ | (uint)!bVar5 * local_59e0._16_4_;
                local_59e0._20_4_ = (uint)bVar6 * auVar56._20_4_ | (uint)!bVar6 * local_59e0._20_4_;
                local_59e0._24_4_ = (uint)bVar7 * auVar56._24_4_ | (uint)!bVar7 * local_59e0._24_4_;
                local_59e0._28_4_ =
                     (uint)(bVar38 >> 7) * auVar56._28_4_ |
                     (uint)!(bool)(bVar38 >> 7) * local_59e0._28_4_;
              }
              goto LAB_01de60f4;
            }
            uVar46 = root.ptr & 0xfffffffffffffff0;
            uVar36 = (uint)root.ptr & 7;
            root.ptr = 8;
            auVar56 = auVar111._0_32_;
            for (; (lVar41 != 0 && (uVar37 = *(ulong *)(uVar46 + 0x40 + lVar41 * 2), uVar37 != 8));
                lVar41 = lVar41 + 4) {
              if ((uVar36 == 6) || (uVar36 == 1)) {
                uVar39 = *(undefined4 *)(uVar46 + 0x120 + lVar41);
                auVar80._4_4_ = uVar39;
                auVar80._0_4_ = uVar39;
                auVar80._8_4_ = uVar39;
                auVar80._12_4_ = uVar39;
                auVar80._16_4_ = uVar39;
                auVar80._20_4_ = uVar39;
                auVar80._24_4_ = uVar39;
                auVar80._28_4_ = uVar39;
                auVar53 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar39 = *(undefined4 *)(uVar46 + 0x60 + lVar41);
                auVar59._4_4_ = uVar39;
                auVar59._0_4_ = uVar39;
                auVar59._8_4_ = uVar39;
                auVar59._12_4_ = uVar39;
                auVar59._16_4_ = uVar39;
                auVar59._20_4_ = uVar39;
                auVar59._24_4_ = uVar39;
                auVar59._28_4_ = uVar39;
                auVar54 = vfmadd213ps_avx512vl(auVar80,auVar53,auVar59);
                uVar39 = *(undefined4 *)(uVar46 + 0x160 + lVar41);
                auVar84._4_4_ = uVar39;
                auVar84._0_4_ = uVar39;
                auVar84._8_4_ = uVar39;
                auVar84._12_4_ = uVar39;
                auVar84._16_4_ = uVar39;
                auVar84._20_4_ = uVar39;
                auVar84._24_4_ = uVar39;
                auVar84._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar46 + 0xa0 + lVar41);
                auVar60._4_4_ = uVar39;
                auVar60._0_4_ = uVar39;
                auVar60._8_4_ = uVar39;
                auVar60._12_4_ = uVar39;
                auVar60._16_4_ = uVar39;
                auVar60._20_4_ = uVar39;
                auVar60._24_4_ = uVar39;
                auVar60._28_4_ = uVar39;
                auVar55 = vfmadd213ps_avx512vl(auVar84,auVar53,auVar60);
                uVar39 = *(undefined4 *)(uVar46 + 0x1a0 + lVar41);
                auVar92._4_4_ = uVar39;
                auVar92._0_4_ = uVar39;
                auVar92._8_4_ = uVar39;
                auVar92._12_4_ = uVar39;
                auVar92._16_4_ = uVar39;
                auVar92._20_4_ = uVar39;
                auVar92._24_4_ = uVar39;
                auVar92._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar46 + 0xe0 + lVar41);
                auVar61._4_4_ = uVar39;
                auVar61._0_4_ = uVar39;
                auVar61._8_4_ = uVar39;
                auVar61._12_4_ = uVar39;
                auVar61._16_4_ = uVar39;
                auVar61._20_4_ = uVar39;
                auVar61._24_4_ = uVar39;
                auVar61._28_4_ = uVar39;
                auVar52 = vfmadd213ps_avx512vl(auVar92,auVar53,auVar61);
                uVar39 = *(undefined4 *)(uVar46 + 0x140 + lVar41);
                auVar94._4_4_ = uVar39;
                auVar94._0_4_ = uVar39;
                auVar94._8_4_ = uVar39;
                auVar94._12_4_ = uVar39;
                auVar94._16_4_ = uVar39;
                auVar94._20_4_ = uVar39;
                auVar94._24_4_ = uVar39;
                auVar94._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar46 + 0x80 + lVar41);
                auVar65._4_4_ = uVar39;
                auVar65._0_4_ = uVar39;
                auVar65._8_4_ = uVar39;
                auVar65._12_4_ = uVar39;
                auVar65._16_4_ = uVar39;
                auVar65._20_4_ = uVar39;
                auVar65._24_4_ = uVar39;
                auVar65._28_4_ = uVar39;
                auVar57 = vfmadd213ps_avx512vl(auVar94,auVar53,auVar65);
                uVar39 = *(undefined4 *)(uVar46 + 0x180 + lVar41);
                auVar96._4_4_ = uVar39;
                auVar96._0_4_ = uVar39;
                auVar96._8_4_ = uVar39;
                auVar96._12_4_ = uVar39;
                auVar96._16_4_ = uVar39;
                auVar96._20_4_ = uVar39;
                auVar96._24_4_ = uVar39;
                auVar96._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar46 + 0xc0 + lVar41);
                auVar66._4_4_ = uVar39;
                auVar66._0_4_ = uVar39;
                auVar66._8_4_ = uVar39;
                auVar66._12_4_ = uVar39;
                auVar66._16_4_ = uVar39;
                auVar66._20_4_ = uVar39;
                auVar66._24_4_ = uVar39;
                auVar66._28_4_ = uVar39;
                auVar58 = vfmadd213ps_avx512vl(auVar96,auVar53,auVar66);
                uVar39 = *(undefined4 *)(uVar46 + 0x1c0 + lVar41);
                auVar99._4_4_ = uVar39;
                auVar99._0_4_ = uVar39;
                auVar99._8_4_ = uVar39;
                auVar99._12_4_ = uVar39;
                auVar99._16_4_ = uVar39;
                auVar99._20_4_ = uVar39;
                auVar99._24_4_ = uVar39;
                auVar99._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar46 + 0x100 + lVar41);
                auVar67._4_4_ = uVar39;
                auVar67._0_4_ = uVar39;
                auVar67._8_4_ = uVar39;
                auVar67._12_4_ = uVar39;
                auVar67._16_4_ = uVar39;
                auVar67._20_4_ = uVar39;
                auVar67._24_4_ = uVar39;
                auVar67._28_4_ = uVar39;
                auVar59 = vfmadd213ps_avx512vl(auVar99,auVar53,auVar67);
                auVar51 = vfmsub213ps_fma(auVar54,local_5b20,local_5ac0);
                auVar83 = vfmsub213ps_fma(auVar55,local_5b00,local_5aa0);
                auVar79 = vfmsub213ps_fma(auVar52,local_5ae0,local_5a80);
                auVar50 = vfmsub213ps_fma(auVar57,local_5b20,local_5ac0);
                auVar98 = vfmsub213ps_fma(auVar58,local_5b00,local_5aa0);
                auVar49 = vfmsub213ps_fma(auVar59,local_5ae0,local_5a80);
                auVar54 = vpminsd_avx2(ZEXT1632(auVar51),ZEXT1632(auVar50));
                auVar55 = vpminsd_avx2(ZEXT1632(auVar83),ZEXT1632(auVar98));
                auVar54 = vpmaxsd_avx2(auVar54,auVar55);
                auVar55 = vpminsd_avx2(ZEXT1632(auVar79),ZEXT1632(auVar49));
                auVar54 = vpmaxsd_avx2(auVar54,auVar55);
                auVar55 = vpmaxsd_avx2(ZEXT1632(auVar51),ZEXT1632(auVar50));
                auVar52 = vpmaxsd_avx2(ZEXT1632(auVar83),ZEXT1632(auVar98));
                auVar52 = vpminsd_avx2(auVar55,auVar52);
                auVar55 = vpmaxsd_avx2(ZEXT1632(auVar79),ZEXT1632(auVar49));
                auVar52 = vpminsd_avx2(auVar52,auVar55);
                auVar68._4_4_ = uStack_59fc;
                auVar68._0_4_ = local_5a00;
                auVar68._8_4_ = uStack_59f8;
                auVar68._12_4_ = uStack_59f4;
                auVar68._16_4_ = uStack_59f0;
                auVar68._20_4_ = uStack_59ec;
                auVar68._24_4_ = uStack_59e8;
                auVar68._28_4_ = uStack_59e4;
                auVar55 = vpmaxsd_avx2(auVar54,auVar68);
                auVar52 = vpminsd_avx2(auVar52,local_59e0);
                uVar47 = vcmpps_avx512vl(auVar55,auVar52,2);
                if (uVar36 == 6) {
                  uVar39 = *(undefined4 *)(uVar46 + 0x1e0 + lVar41);
                  auVar17._4_4_ = uVar39;
                  auVar17._0_4_ = uVar39;
                  auVar17._8_4_ = uVar39;
                  auVar17._12_4_ = uVar39;
                  auVar17._16_4_ = uVar39;
                  auVar17._20_4_ = uVar39;
                  auVar17._24_4_ = uVar39;
                  auVar17._28_4_ = uVar39;
                  uVar42 = vcmpps_avx512vl(auVar53,auVar17,0xd);
                  uVar39 = *(undefined4 *)(uVar46 + 0x200 + lVar41);
                  auVar18._4_4_ = uVar39;
                  auVar18._0_4_ = uVar39;
                  auVar18._8_4_ = uVar39;
                  auVar18._12_4_ = uVar39;
                  auVar18._16_4_ = uVar39;
                  auVar18._20_4_ = uVar39;
                  auVar18._24_4_ = uVar39;
                  auVar18._28_4_ = uVar39;
                  uVar16 = vcmpps_avx512vl(auVar53,auVar18,1);
                  uVar47 = uVar47 & uVar42 & uVar16;
                }
              }
              else {
                uVar39 = *(undefined4 *)(uVar46 + 0x60 + lVar41);
                auVar95._4_4_ = uVar39;
                auVar95._0_4_ = uVar39;
                auVar95._8_4_ = uVar39;
                auVar95._12_4_ = uVar39;
                auVar95._16_4_ = uVar39;
                auVar95._20_4_ = uVar39;
                auVar95._24_4_ = uVar39;
                auVar95._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar46 + 0x80 + lVar41);
                auVar93._4_4_ = uVar39;
                auVar93._0_4_ = uVar39;
                auVar93._8_4_ = uVar39;
                auVar93._12_4_ = uVar39;
                auVar93._16_4_ = uVar39;
                auVar93._20_4_ = uVar39;
                auVar93._24_4_ = uVar39;
                auVar93._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar46 + 0xa0 + lVar41);
                auVar85._4_4_ = uVar39;
                auVar85._0_4_ = uVar39;
                auVar85._8_4_ = uVar39;
                auVar85._12_4_ = uVar39;
                auVar85._16_4_ = uVar39;
                auVar85._20_4_ = uVar39;
                auVar85._24_4_ = uVar39;
                auVar85._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar46 + 0xc0 + lVar41);
                auVar106._4_4_ = uVar39;
                auVar106._0_4_ = uVar39;
                auVar106._8_4_ = uVar39;
                auVar106._12_4_ = uVar39;
                auVar106._16_4_ = uVar39;
                auVar106._20_4_ = uVar39;
                auVar106._24_4_ = uVar39;
                auVar106._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar46 + 0xe0 + lVar41);
                auVar103._4_4_ = uVar39;
                auVar103._0_4_ = uVar39;
                auVar103._8_4_ = uVar39;
                auVar103._12_4_ = uVar39;
                auVar103._16_4_ = uVar39;
                auVar103._20_4_ = uVar39;
                auVar103._24_4_ = uVar39;
                auVar103._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar46 + 0x100 + lVar41);
                auVar101._4_4_ = uVar39;
                auVar101._0_4_ = uVar39;
                auVar101._8_4_ = uVar39;
                auVar101._12_4_ = uVar39;
                auVar101._16_4_ = uVar39;
                auVar101._20_4_ = uVar39;
                auVar101._24_4_ = uVar39;
                auVar101._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar46 + 0x120 + lVar41);
                auVar81._4_4_ = uVar39;
                auVar81._0_4_ = uVar39;
                auVar81._8_4_ = uVar39;
                auVar81._12_4_ = uVar39;
                auVar81._16_4_ = uVar39;
                auVar81._20_4_ = uVar39;
                auVar81._24_4_ = uVar39;
                auVar81._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar46 + 0x140 + lVar41);
                auVar78._4_4_ = uVar39;
                auVar78._0_4_ = uVar39;
                auVar78._8_4_ = uVar39;
                auVar78._12_4_ = uVar39;
                auVar78._16_4_ = uVar39;
                auVar78._20_4_ = uVar39;
                auVar78._24_4_ = uVar39;
                auVar78._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar46 + 0x160 + lVar41);
                auVar77._4_4_ = uVar39;
                auVar77._0_4_ = uVar39;
                auVar77._8_4_ = uVar39;
                auVar77._12_4_ = uVar39;
                auVar77._16_4_ = uVar39;
                auVar77._20_4_ = uVar39;
                auVar77._24_4_ = uVar39;
                auVar77._28_4_ = uVar39;
                auVar53 = *(undefined1 (*) [32])(ray + 0xe0);
                auVar67 = auVar109._0_32_;
                auVar54 = vsubps_avx512vl(auVar67,auVar53);
                uVar39 = *(undefined4 *)(uVar46 + 0x1e0 + lVar41);
                auVar19._4_4_ = uVar39;
                auVar19._0_4_ = uVar39;
                auVar19._8_4_ = uVar39;
                auVar19._12_4_ = uVar39;
                auVar19._16_4_ = uVar39;
                auVar19._20_4_ = uVar39;
                auVar19._24_4_ = uVar39;
                auVar19._28_4_ = uVar39;
                auVar55 = vmulps_avx512vl(auVar53,auVar19);
                uVar39 = *(undefined4 *)(uVar46 + 0x200 + lVar41);
                auVar20._4_4_ = uVar39;
                auVar20._0_4_ = uVar39;
                auVar20._8_4_ = uVar39;
                auVar20._12_4_ = uVar39;
                auVar20._16_4_ = uVar39;
                auVar20._20_4_ = uVar39;
                auVar20._24_4_ = uVar39;
                auVar20._28_4_ = uVar39;
                auVar52 = vmulps_avx512vl(auVar53,auVar20);
                uVar39 = *(undefined4 *)(uVar46 + 0x220 + lVar41);
                auVar21._4_4_ = uVar39;
                auVar21._0_4_ = uVar39;
                auVar21._8_4_ = uVar39;
                auVar21._12_4_ = uVar39;
                auVar21._16_4_ = uVar39;
                auVar21._20_4_ = uVar39;
                auVar21._24_4_ = uVar39;
                auVar21._28_4_ = uVar39;
                auVar57 = vmulps_avx512vl(auVar53,auVar21);
                auVar60 = auVar110._0_32_;
                auVar55 = vfmadd231ps_avx512vl(auVar55,auVar54,auVar60);
                auVar52 = vfmadd231ps_avx512vl(auVar52,auVar54,auVar60);
                uVar39 = *(undefined4 *)(uVar46 + 0x240 + lVar41);
                auVar22._4_4_ = uVar39;
                auVar22._0_4_ = uVar39;
                auVar22._8_4_ = uVar39;
                auVar22._12_4_ = uVar39;
                auVar22._16_4_ = uVar39;
                auVar22._20_4_ = uVar39;
                auVar22._24_4_ = uVar39;
                auVar22._28_4_ = uVar39;
                auVar58 = vmulps_avx512vl(auVar53,auVar22);
                uVar39 = *(undefined4 *)(uVar46 + 0x260 + lVar41);
                auVar23._4_4_ = uVar39;
                auVar23._0_4_ = uVar39;
                auVar23._8_4_ = uVar39;
                auVar23._12_4_ = uVar39;
                auVar23._16_4_ = uVar39;
                auVar23._20_4_ = uVar39;
                auVar23._24_4_ = uVar39;
                auVar23._28_4_ = uVar39;
                auVar59 = vmulps_avx512vl(auVar53,auVar23);
                auVar57 = vfmadd231ps_avx512vl(auVar57,auVar54,auVar60);
                uVar39 = *(undefined4 *)(uVar46 + 0x280 + lVar41);
                auVar24._4_4_ = uVar39;
                auVar24._0_4_ = uVar39;
                auVar24._8_4_ = uVar39;
                auVar24._12_4_ = uVar39;
                auVar24._16_4_ = uVar39;
                auVar24._20_4_ = uVar39;
                auVar24._24_4_ = uVar39;
                auVar24._28_4_ = uVar39;
                auVar53 = vmulps_avx512vl(auVar53,auVar24);
                auVar58 = vaddps_avx512vl(auVar54,auVar58);
                auVar59 = vaddps_avx512vl(auVar54,auVar59);
                auVar54 = vaddps_avx512vl(auVar54,auVar53);
                auVar29._4_4_ = local_5be0._4_4_;
                auVar29._0_4_ = local_5be0._0_4_;
                auVar29._8_4_ = local_5be0._8_4_;
                auVar29._12_4_ = local_5be0._12_4_;
                auVar29._16_4_ = local_5be0._16_4_;
                auVar29._20_4_ = local_5be0._20_4_;
                auVar29._24_4_ = local_5be0._24_4_;
                auVar29._28_4_ = local_5be0._28_4_;
                auVar30._4_4_ = local_5be0._36_4_;
                auVar30._0_4_ = local_5be0._32_4_;
                auVar30._8_4_ = local_5be0._40_4_;
                auVar30._12_4_ = local_5be0._44_4_;
                auVar30._16_4_ = local_5be0._48_4_;
                auVar30._20_4_ = local_5be0._52_4_;
                auVar30._24_4_ = local_5be0._56_4_;
                auVar30._28_4_ = local_5be0._60_4_;
                auVar31._4_4_ = local_5be0._68_4_;
                auVar31._0_4_ = local_5be0._64_4_;
                auVar31._8_4_ = local_5be0._72_4_;
                auVar31._12_4_ = local_5be0._76_4_;
                auVar31._16_4_ = local_5be0._80_4_;
                auVar31._20_4_ = local_5be0._84_4_;
                auVar31._24_4_ = local_5be0._88_4_;
                auVar31._28_4_ = local_5be0._92_4_;
                auVar53 = vmulps_avx512vl(auVar81,local_5b40);
                auVar60 = vmulps_avx512vl(auVar78,local_5b40);
                auVar61 = vmulps_avx512vl(auVar77,local_5b40);
                auVar53 = vfmadd231ps_avx512vl(auVar53,local_5b60,auVar106);
                auVar60 = vfmadd231ps_avx512vl(auVar60,local_5b60,auVar103);
                auVar61 = vfmadd231ps_avx512vl(auVar61,auVar101,local_5b60);
                auVar53 = vfmadd231ps_avx512vl(auVar53,local_5b80,auVar95);
                auVar60 = vfmadd231ps_avx512vl(auVar60,local_5b80,auVar93);
                auVar61 = vfmadd231ps_avx512vl(auVar61,auVar85,local_5b80);
                auVar65 = auVar107._0_32_;
                vandps_avx512vl(auVar53,auVar65);
                auVar66 = auVar108._0_32_;
                uVar47 = vcmpps_avx512vl(auVar61,auVar66,1);
                bVar35 = (bool)((byte)uVar47 & 1);
                iVar48 = auVar108._0_4_;
                auVar62._0_4_ = (uint)bVar35 * iVar48 | (uint)!bVar35 * auVar53._0_4_;
                bVar35 = (bool)((byte)(uVar47 >> 1) & 1);
                iVar70 = auVar108._4_4_;
                auVar62._4_4_ = (uint)bVar35 * iVar70 | (uint)!bVar35 * auVar53._4_4_;
                bVar35 = (bool)((byte)(uVar47 >> 2) & 1);
                iVar71 = auVar108._8_4_;
                auVar62._8_4_ = (uint)bVar35 * iVar71 | (uint)!bVar35 * auVar53._8_4_;
                bVar35 = (bool)((byte)(uVar47 >> 3) & 1);
                iVar72 = auVar108._12_4_;
                auVar62._12_4_ = (uint)bVar35 * iVar72 | (uint)!bVar35 * auVar53._12_4_;
                bVar35 = (bool)((byte)(uVar47 >> 4) & 1);
                iVar73 = auVar108._16_4_;
                auVar62._16_4_ = (uint)bVar35 * iVar73 | (uint)!bVar35 * auVar53._16_4_;
                bVar35 = (bool)((byte)(uVar47 >> 5) & 1);
                iVar74 = auVar108._20_4_;
                auVar62._20_4_ = (uint)bVar35 * iVar74 | (uint)!bVar35 * auVar53._20_4_;
                bVar35 = (bool)((byte)(uVar47 >> 6) & 1);
                iVar75 = auVar108._24_4_;
                iVar76 = auVar108._28_4_;
                auVar62._24_4_ = (uint)bVar35 * iVar75 | (uint)!bVar35 * auVar53._24_4_;
                bVar35 = SUB81(uVar47 >> 7,0);
                auVar62._28_4_ = (uint)bVar35 * iVar76 | (uint)!bVar35 * auVar53._28_4_;
                vandps_avx512vl(auVar60,auVar65);
                uVar47 = vcmpps_avx512vl(auVar62,auVar66,1);
                bVar35 = (bool)((byte)uVar47 & 1);
                auVar63._0_4_ = (uint)bVar35 * iVar48 | (uint)!bVar35 * auVar60._0_4_;
                bVar35 = (bool)((byte)(uVar47 >> 1) & 1);
                auVar63._4_4_ = (uint)bVar35 * iVar70 | (uint)!bVar35 * auVar60._4_4_;
                bVar35 = (bool)((byte)(uVar47 >> 2) & 1);
                auVar63._8_4_ = (uint)bVar35 * iVar71 | (uint)!bVar35 * auVar60._8_4_;
                bVar35 = (bool)((byte)(uVar47 >> 3) & 1);
                auVar63._12_4_ = (uint)bVar35 * iVar72 | (uint)!bVar35 * auVar60._12_4_;
                bVar35 = (bool)((byte)(uVar47 >> 4) & 1);
                auVar63._16_4_ = (uint)bVar35 * iVar73 | (uint)!bVar35 * auVar60._16_4_;
                bVar35 = (bool)((byte)(uVar47 >> 5) & 1);
                auVar63._20_4_ = (uint)bVar35 * iVar74 | (uint)!bVar35 * auVar60._20_4_;
                bVar35 = (bool)((byte)(uVar47 >> 6) & 1);
                auVar63._24_4_ = (uint)bVar35 * iVar75 | (uint)!bVar35 * auVar60._24_4_;
                bVar35 = SUB81(uVar47 >> 7,0);
                auVar63._28_4_ = (uint)bVar35 * iVar76 | (uint)!bVar35 * auVar60._28_4_;
                vandps_avx512vl(auVar61,auVar65);
                uVar47 = vcmpps_avx512vl(auVar63,auVar66,1);
                bVar35 = (bool)((byte)uVar47 & 1);
                auVar64._0_4_ = (uint)bVar35 * iVar48 | (uint)!bVar35 * auVar61._0_4_;
                bVar35 = (bool)((byte)(uVar47 >> 1) & 1);
                auVar64._4_4_ = (uint)bVar35 * iVar70 | (uint)!bVar35 * auVar61._4_4_;
                bVar35 = (bool)((byte)(uVar47 >> 2) & 1);
                auVar64._8_4_ = (uint)bVar35 * iVar71 | (uint)!bVar35 * auVar61._8_4_;
                bVar35 = (bool)((byte)(uVar47 >> 3) & 1);
                auVar64._12_4_ = (uint)bVar35 * iVar72 | (uint)!bVar35 * auVar61._12_4_;
                bVar35 = (bool)((byte)(uVar47 >> 4) & 1);
                auVar64._16_4_ = (uint)bVar35 * iVar73 | (uint)!bVar35 * auVar61._16_4_;
                bVar35 = (bool)((byte)(uVar47 >> 5) & 1);
                auVar64._20_4_ = (uint)bVar35 * iVar74 | (uint)!bVar35 * auVar61._20_4_;
                bVar35 = (bool)((byte)(uVar47 >> 6) & 1);
                auVar64._24_4_ = (uint)bVar35 * iVar75 | (uint)!bVar35 * auVar61._24_4_;
                bVar35 = SUB81(uVar47 >> 7,0);
                auVar64._28_4_ = (uint)bVar35 * iVar76 | (uint)!bVar35 * auVar61._28_4_;
                auVar53 = vrcp14ps_avx512vl(auVar62);
                auVar60 = vfnmadd213ps_avx512vl(auVar62,auVar53,auVar67);
                auVar60 = vfmadd132ps_avx512vl(auVar60,auVar53,auVar53);
                auVar53 = vrcp14ps_avx512vl(auVar63);
                auVar61 = vfnmadd213ps_avx512vl(auVar63,auVar53,auVar67);
                auVar61 = vfmadd132ps_avx512vl(auVar61,auVar53,auVar53);
                auVar53 = vrcp14ps_avx512vl(auVar64);
                auVar65 = vfnmadd213ps_avx512vl(auVar64,auVar53,auVar67);
                uVar39 = *(undefined4 *)(uVar46 + 0x180 + lVar41);
                auVar25._4_4_ = uVar39;
                auVar25._0_4_ = uVar39;
                auVar25._8_4_ = uVar39;
                auVar25._12_4_ = uVar39;
                auVar25._16_4_ = uVar39;
                auVar25._20_4_ = uVar39;
                auVar25._24_4_ = uVar39;
                auVar25._28_4_ = uVar39;
                auVar66 = vfmadd213ps_avx512vl(auVar81,auVar31,auVar25);
                uVar39 = *(undefined4 *)(uVar46 + 0x1a0 + lVar41);
                auVar26._4_4_ = uVar39;
                auVar26._0_4_ = uVar39;
                auVar26._8_4_ = uVar39;
                auVar26._12_4_ = uVar39;
                auVar26._16_4_ = uVar39;
                auVar26._20_4_ = uVar39;
                auVar26._24_4_ = uVar39;
                auVar26._28_4_ = uVar39;
                auVar67 = vfmadd213ps_avx512vl(auVar78,auVar31,auVar26);
                auVar65 = vfmadd132ps_avx512vl(auVar65,auVar53,auVar53);
                uVar39 = *(undefined4 *)(uVar46 + 0x1c0 + lVar41);
                auVar27._4_4_ = uVar39;
                auVar27._0_4_ = uVar39;
                auVar27._8_4_ = uVar39;
                auVar27._12_4_ = uVar39;
                auVar27._16_4_ = uVar39;
                auVar27._20_4_ = uVar39;
                auVar27._24_4_ = uVar39;
                auVar27._28_4_ = uVar39;
                auVar53 = vfmadd213ps_avx512vl(auVar77,auVar31,auVar27);
                auVar66 = vfmadd231ps_avx512vl(auVar66,auVar30,auVar106);
                auVar67 = vfmadd231ps_avx512vl(auVar67,auVar30,auVar103);
                auVar53 = vfmadd231ps_avx512vl(auVar53,auVar30,auVar101);
                auVar66 = vfmadd231ps_avx512vl(auVar66,auVar29,auVar95);
                auVar67 = vfmadd231ps_avx512vl(auVar67,auVar29,auVar93);
                auVar68 = vfmadd231ps_avx512vl(auVar53,auVar29,auVar85);
                auVar53 = vsubps_avx(auVar55,auVar66);
                auVar55 = vmulps_avx512vl(auVar60,auVar53);
                auVar53 = vsubps_avx(auVar52,auVar67);
                auVar52 = vmulps_avx512vl(auVar61,auVar53);
                auVar53 = vsubps_avx(auVar57,auVar68);
                auVar57 = vmulps_avx512vl(auVar65,auVar53);
                auVar53 = vsubps_avx512vl(auVar58,auVar66);
                auVar58 = vmulps_avx512vl(auVar60,auVar53);
                auVar53 = vsubps_avx(auVar59,auVar67);
                auVar59 = vmulps_avx512vl(auVar61,auVar53);
                auVar53 = vsubps_avx(auVar54,auVar68);
                auVar60 = vmulps_avx512vl(auVar65,auVar53);
                auVar53 = vpminsd_avx2(auVar55,auVar58);
                auVar54 = vpminsd_avx2(auVar52,auVar59);
                auVar53 = vpmaxsd_avx2(auVar53,auVar54);
                auVar54 = vpminsd_avx2(auVar57,auVar60);
                auVar54 = vpmaxsd_avx2(auVar53,auVar54);
                auVar53 = vpmaxsd_avx2(auVar55,auVar58);
                auVar55 = vpmaxsd_avx2(auVar52,auVar59);
                auVar55 = vpminsd_avx2(auVar53,auVar55);
                auVar53 = vpmaxsd_avx2(auVar57,auVar60);
                auVar53 = vpminsd_avx2(auVar55,auVar53);
                auVar32._4_4_ = uStack_59fc;
                auVar32._0_4_ = local_5a00;
                auVar32._8_4_ = uStack_59f8;
                auVar32._12_4_ = uStack_59f4;
                auVar32._16_4_ = uStack_59f0;
                auVar32._20_4_ = uStack_59ec;
                auVar32._24_4_ = uStack_59e8;
                auVar32._28_4_ = uStack_59e4;
                auVar55 = vpmaxsd_avx2(auVar54,auVar32);
                auVar53 = vpminsd_avx2(auVar53,local_59e0);
                uVar47 = vcmpps_avx512vl(auVar55,auVar53,2);
              }
              uVar42 = vcmpps_avx512vl(local_59e0,auVar112._0_32_,6);
              uVar47 = uVar47 & uVar42;
              uVar42 = root.ptr;
              auVar69 = auVar56;
              if ((byte)uVar47 != 0) {
                auVar54 = vblendmps_avx512vl(auVar111._0_32_,auVar54);
                bVar35 = (bool)((byte)uVar47 & 1);
                auVar69._0_4_ = (uint)bVar35 * auVar54._0_4_ | (uint)!bVar35 * auVar53._0_4_;
                bVar35 = (bool)((byte)(uVar47 >> 1) & 1);
                auVar69._4_4_ = (uint)bVar35 * auVar54._4_4_ | (uint)!bVar35 * auVar53._4_4_;
                bVar35 = (bool)((byte)(uVar47 >> 2) & 1);
                auVar69._8_4_ = (uint)bVar35 * auVar54._8_4_ | (uint)!bVar35 * auVar53._8_4_;
                bVar35 = (bool)((byte)(uVar47 >> 3) & 1);
                auVar69._12_4_ = (uint)bVar35 * auVar54._12_4_ | (uint)!bVar35 * auVar53._12_4_;
                bVar35 = (bool)((byte)(uVar47 >> 4) & 1);
                auVar69._16_4_ = (uint)bVar35 * auVar54._16_4_ | (uint)!bVar35 * auVar53._16_4_;
                bVar35 = (bool)((byte)(uVar47 >> 5) & 1);
                auVar69._20_4_ = (uint)bVar35 * auVar54._20_4_ | (uint)!bVar35 * auVar53._20_4_;
                bVar35 = (bool)((byte)(uVar47 >> 6) & 1);
                auVar69._24_4_ = (uint)bVar35 * auVar54._24_4_ | (uint)!bVar35 * auVar53._24_4_;
                bVar35 = SUB81(uVar47 >> 7,0);
                auVar69._28_4_ = (uint)bVar35 * auVar54._28_4_ | (uint)!bVar35 * auVar53._28_4_;
                uVar42 = uVar37;
                if (root.ptr != 8) {
                  *puVar40 = root.ptr;
                  puVar40 = puVar40 + 1;
                  *pauVar44 = auVar56;
                  pauVar44 = pauVar44 + 1;
                }
              }
              auVar56 = auVar69;
              root.ptr = uVar42;
            }
            if (root.ptr == 8) goto LAB_01de65a3;
            uVar15 = vcmpps_avx512vl(auVar56,local_59e0,9);
            auVar112 = ZEXT3264(auVar56);
          } while ((byte)uVar43 < (byte)POPCOUNT((int)uVar15));
          *puVar40 = root.ptr;
          puVar40 = puVar40 + 1;
          *pauVar44 = auVar56;
          pauVar44 = pauVar44 + 1;
LAB_01de65a3:
          iVar48 = 4;
        }
        else {
          while (bVar34 = (byte)local_5c44, uVar46 != 0) {
            sVar1 = 0;
            for (uVar37 = uVar46; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
              sVar1 = sVar1 + 1;
            }
            uVar46 = uVar46 - 1 & uVar46;
            bVar35 = occluded1(This,bvh,root,sVar1,(Precalculations *)&local_59c0,ray,
                               (TravRayK<8,_false> *)&local_5be0.field_0,context);
            bVar38 = (byte)(1 << ((uint)sVar1 & 0x1f));
            if (!bVar35) {
              bVar38 = 0;
            }
            local_5c44 = (uint)(bVar34 | bVar38);
          }
          iVar48 = 3;
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar107 = ZEXT3264(auVar53);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar108 = ZEXT3264(auVar53);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar109 = ZEXT3264(auVar53);
          auVar51 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
          auVar110 = ZEXT1664(auVar51);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar111 = ZEXT3264(auVar53);
          auVar112 = ZEXT3264(auVar56);
          if (bVar34 != 0xff) {
            auVar56 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar35 = (bool)((byte)(local_5c44 >> 1) & 1);
            bVar3 = (bool)((byte)(local_5c44 >> 2) & 1);
            bVar4 = (bool)((byte)(local_5c44 >> 3) & 1);
            bVar5 = (bool)((byte)(local_5c44 >> 4) & 1);
            bVar6 = (bool)((byte)(local_5c44 >> 5) & 1);
            bVar7 = (bool)((byte)(local_5c44 >> 6) & 1);
            local_59e0._4_4_ = (uint)bVar35 * auVar56._4_4_ | (uint)!bVar35 * local_59e0._4_4_;
            local_59e0._0_4_ =
                 (uint)(bVar34 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar34 & 1) * local_59e0._0_4_;
            local_59e0._8_4_ = (uint)bVar3 * auVar56._8_4_ | (uint)!bVar3 * local_59e0._8_4_;
            local_59e0._12_4_ = (uint)bVar4 * auVar56._12_4_ | (uint)!bVar4 * local_59e0._12_4_;
            local_59e0._16_4_ = (uint)bVar5 * auVar56._16_4_ | (uint)!bVar5 * local_59e0._16_4_;
            local_59e0._20_4_ = (uint)bVar6 * auVar56._20_4_ | (uint)!bVar6 * local_59e0._20_4_;
            local_59e0._24_4_ = (uint)bVar7 * auVar56._24_4_ | (uint)!bVar7 * local_59e0._24_4_;
            local_59e0._28_4_ =
                 (local_5c44 >> 7) * auVar56._28_4_ |
                 (uint)!SUB41(local_5c44 >> 7,0) * local_59e0._28_4_;
            iVar48 = 2;
          }
          if (uVar43 < (uint)POPCOUNT(uVar39)) goto LAB_01de613b;
        }
        if (iVar48 == 3) {
LAB_01de67de:
          local_5c44._0_1_ = (byte)local_5c44 & bVar45;
          bVar35 = (bool)((byte)local_5c44 >> 1 & 1);
          bVar3 = (bool)((byte)local_5c44 >> 2 & 1);
          bVar4 = (bool)((byte)local_5c44 >> 3 & 1);
          bVar5 = (bool)((byte)local_5c44 >> 4 & 1);
          bVar6 = (bool)((byte)local_5c44 >> 5 & 1);
          bVar7 = (bool)((byte)local_5c44 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)((byte)local_5c44 & 1) * -0x800000 |
               (uint)!(bool)((byte)local_5c44 & 1) * *(int *)(ray + 0x100);
          *(uint *)(ray + 0x104) = (uint)bVar35 * -0x800000 | (uint)!bVar35 * *(int *)(ray + 0x104);
          *(uint *)(ray + 0x108) = (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(ray + 0x108);
          *(uint *)(ray + 0x10c) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x10c);
          *(uint *)(ray + 0x110) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x110);
          *(uint *)(ray + 0x114) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x114);
          *(uint *)(ray + 0x118) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x118);
          *(uint *)(ray + 0x11c) =
               (uint)((byte)local_5c44 >> 7) * -0x800000 |
               (uint)!(bool)((byte)local_5c44 >> 7) * *(int *)(ray + 0x11c);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }